

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

reference __thiscall
absl::InlinedVector<int,_4UL,_std::allocator<int>_>::GrowAndEmplaceBack<int>
          (InlinedVector<int,_4UL,_std::allocator<int>_> *this,int *args)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  Rep *pRVar4;
  ulong uVar5;
  long lVar6;
  Allocation new_allocation;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  uVar5 = uVar1 >> 1;
  uVar2 = 4;
  if ((uVar1 & 1) != 0) {
    uVar2 = *(ulong *)&this->rep_;
  }
  if (uVar5 == uVar2) {
    piVar3 = __gnu_cxx::new_allocator<int>::allocate
                       ((new_allocator<int> *)this,uVar1 & 0xfffffffffffffffe,(void *)0x0);
    piVar3[uVar5] = *args;
    if (((this->allocator_and_tag_).tag_.size_ & 1) == 0) {
      pRVar4 = &this->rep_;
    }
    else {
      pRVar4 = *(Rep **)((long)&this->rep_ + 8);
    }
    if (1 < uVar1) {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)piVar3 + lVar6) = *(undefined4 *)((long)pRVar4 + lVar6);
        lVar6 = lVar6 + 4;
      } while (uVar5 * 4 - lVar6 != 0);
    }
    new_allocation.buffer_ = piVar3;
    new_allocation.capacity_ = uVar1 & 0xfffffffffffffffe;
    ResetAllocation(this,new_allocation,uVar5 + 1);
    return piVar3 + uVar5;
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<int, 4>::GrowAndEmplaceBack(Args &&...) [T = int, N = 4, A = std::allocator<int>, Args = <int>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }